

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall Block::WriteFile(Block *this)

{
  ostream *poVar1;
  ofstream out;
  long local_210;
  filebuf local_208 [24];
  byte abStack_1f0 [216];
  ios_base local_118 [264];
  
  std::ofstream::ofstream((string *)&local_210);
  std::ofstream::open((string *)&local_210,(_Ios_Openmode)this);
  if ((abStack_1f0[*(long *)(local_210 + -0x18)] & 1) == 0) {
    std::ostream::seekp(&local_210,(long)this->FileOff << 0xd,0);
    std::ostream::write((char *)&local_210,(long)this->data);
    std::ofstream::close();
    local_210 = _VTT;
    *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_208);
    std::ios_base::~ios_base(local_118);
    return;
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->FileName)._M_dataplus._M_p,
                      (this->FileName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": No such a file!",0x11);
  std::endl<char,std::char_traits<char>>(poVar1);
  system("pause");
  exit(1);
}

Assistant:

void Block::WriteFile(void) {
	ofstream out;
	out.open(this->FileName, ios::out | ios::in | ios::binary);
    if (out.bad()) {
        cout << this->FileName << ": No such a file!" << endl;
        system("pause");
        exit(1);
    }
	out.seekp(this->FileOff * BLOCK_SIZE);
	//cout << out.tellp() << endl;
	out.write(reinterpret_cast<char*>(this->data), BLOCK_SIZE);
	out.close();
}